

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::NTSCD::visit(NTSCD *this,Block *node)

{
  bool bVar1;
  mapped_type *pmVar2;
  Block *node_00;
  reference ppBVar3;
  NTSCD *in_RSI;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_RDI;
  Block *predecessor;
  iterator __end3;
  iterator __begin3;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range3;
  unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
  *in_stack_ffffffffffffffd0;
  Block *this_00;
  _Self local_28;
  _Self local_20;
  
  pmVar2 = std::
           unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
           ::operator[](in_stack_ffffffffffffffd0,(key_type *)in_RDI);
  if (pmVar2->outDegreeCounter != 0) {
    pmVar2 = std::
             unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
             ::operator[](in_stack_ffffffffffffffd0,(key_type *)in_RDI);
    pmVar2->outDegreeCounter = pmVar2->outDegreeCounter - 1;
    pmVar2 = std::
             unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
             ::operator[](in_stack_ffffffffffffffd0,(key_type *)in_RDI);
    if (pmVar2->outDegreeCounter == 0) {
      pmVar2 = std::
               unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::NTSCD::NodeInfo,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::NTSCD::NodeInfo>_>_>
               ::operator[](in_stack_ffffffffffffffd0,(key_type *)in_RDI);
      pmVar2->red = true;
      node_00 = (Block *)Block::predecessors((Block *)in_RSI);
      local_20._M_node =
           (_Base_ptr)
           std::
           set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::begin(in_RDI);
      local_28._M_node =
           (_Base_ptr)
           std::
           set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::end(in_RDI);
      while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
        ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                            ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x2295ba);
        this_00 = *ppBVar3;
        visit(in_RSI,node_00);
        std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
                  ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)this_00);
      }
    }
  }
  return;
}

Assistant:

void NTSCD::visit(Block *node) {
    if (nodeInfo[node].outDegreeCounter == 0) {
        return;
    }
    nodeInfo[node].outDegreeCounter--;
    if (nodeInfo[node].outDegreeCounter == 0) {
        nodeInfo[node].red = true;
        for (auto *predecessor : node->predecessors()) {
            visit(predecessor);
        }
    }
}